

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void ZopfliAllocHash(size_t window_size,ZopfliHash *h)

{
  void *pvVar1;
  undefined8 *in_RSI;
  long in_RDI;
  
  pvVar1 = malloc(0x40000);
  *in_RSI = pvVar1;
  pvVar1 = malloc(in_RDI << 1);
  in_RSI[1] = pvVar1;
  pvVar1 = malloc(in_RDI << 2);
  in_RSI[2] = pvVar1;
  pvVar1 = malloc(in_RDI << 1);
  in_RSI[8] = pvVar1;
  pvVar1 = malloc(0x40000);
  in_RSI[4] = pvVar1;
  pvVar1 = malloc(in_RDI << 1);
  in_RSI[5] = pvVar1;
  pvVar1 = malloc(in_RDI << 2);
  in_RSI[6] = pvVar1;
  return;
}

Assistant:

void ZopfliAllocHash(size_t window_size, ZopfliHash* h) {
  h->head = (int*)malloc(sizeof(*h->head) * 65536);
  h->prev = (unsigned short*)malloc(sizeof(*h->prev) * window_size);
  h->hashval = (int*)malloc(sizeof(*h->hashval) * window_size);

#ifdef ZOPFLI_HASH_SAME
  h->same = (unsigned short*)malloc(sizeof(*h->same) * window_size);
#endif

#ifdef ZOPFLI_HASH_SAME_HASH
  h->head2 = (int*)malloc(sizeof(*h->head2) * 65536);
  h->prev2 = (unsigned short*)malloc(sizeof(*h->prev2) * window_size);
  h->hashval2 = (int*)malloc(sizeof(*h->hashval2) * window_size);
#endif
}